

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
jsoncons::decode_traits<std::vector<int,std::allocator<int>>,char,void>::
decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
          (basic_staj_cursor<char> *cursor,
          json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
          *param_2,error_code *ec)

{
  bool bVar1;
  staj_event_type sVar2;
  basic_staj_event<char> *pbVar3;
  size_t sVar4;
  error_code *in_RCX;
  long *in_RSI;
  error_code *in_RDI;
  typed_array_visitor<std::vector<int,_std::allocator<int>_>_> visitor;
  vector<int,_std::allocator<int>_> *v;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff88;
  basic_staj_event<char> *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  conv_errc __e;
  error_code *this;
  undefined1 local_50 [47];
  byte local_21;
  error_code *local_20;
  long *local_10;
  
  __e = (conv_errc)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  this = in_RDI;
  local_20 = in_RCX;
  local_10 = in_RSI;
  (**(code **)(*in_RSI + 0x10))();
  bVar1 = std::error_code::operator_cast_to_bool(local_20);
  if (bVar1) {
    memset(this,0,0x18);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x3b1914);
  }
  else {
    pbVar3 = (basic_staj_event<char> *)(**(code **)(*local_10 + 0x20))();
    sVar2 = basic_staj_event<char>::event_type(pbVar3);
    if (sVar2 == begin_array) {
      local_21 = 0;
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x3b1948);
      pbVar3 = (basic_staj_event<char> *)(**(code **)(*local_10 + 0x20))();
      sVar4 = basic_staj_event<char>::size(pbVar3);
      if (sVar4 != 0) {
        in_stack_ffffffffffffff90 = (basic_staj_event<char> *)(**(code **)(*local_10 + 0x20))();
        sVar4 = basic_staj_event<char>::size(in_stack_ffffffffffffff90);
        decode_traits<std::vector<int,_std::allocator<int>_>,_char,_void>::reserve_storage
                  (this,sVar4);
      }
      typed_array_visitor<std::vector<int,_std::allocator<int>_>_>::typed_array_visitor
                ((typed_array_visitor<std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      (**(code **)(*local_10 + 0x30))(local_10,local_50,local_20);
      local_21 = 1;
      typed_array_visitor<std::vector<int,_std::allocator<int>_>_>::~typed_array_visitor
                ((typed_array_visitor<std::vector<int,_std::allocator<int>_>_> *)0x3b19e7);
      if ((local_21 & 1) == 0) {
        std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
      }
    }
    else {
      std::error_code::operator=(this,__e);
      memset(this,0,0x18);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x3b1a4c);
    }
  }
  return (vector<int,_std::allocator<int>_> *)in_RDI;
}

Assistant:

static T decode(basic_staj_cursor<CharT>& cursor, 
            json_decoder<Json,TempAllocator>&, 
            std::error_code& ec)
        {
            cursor.array_expected(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return T{};
            }
            switch (cursor.current().event_type())
            {
                case staj_event_type::begin_array:
                {
                    T v;
                    if (cursor.current().size() > 0)
                    {
                        reserve_storage(typename std::integral_constant<bool, ext_traits::has_reserve<T>::value>::type(), v, cursor.current().size());
                    }
                    typed_array_visitor<T> visitor(v);
                    cursor.read_to(visitor, ec);
                    return v;
                }
                default:
                {
                    ec = conv_errc::not_vector;
                    return T{};
                }
            }
        }